

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Symbol * __thiscall slang::ast::ExplicitImportSymbol::importedSymbol(ExplicitImportSymbol *this)

{
  string_view lookupName;
  string_view arg;
  string_view arg_00;
  string_view packageName;
  bool bVar1;
  Scope *pSVar2;
  SourceLocation errorLoc;
  PackageImportItemSyntax *pPVar3;
  PackageSymbol *pPVar4;
  Symbol *pSVar5;
  Diagnostic *this_00;
  Symbol *in_RDI;
  Scope *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  Diagnostic *diag;
  SyntaxNode *syntax_1;
  SyntaxNode *syntax;
  SourceLocation loc;
  Scope *scope;
  char *pcVar6;
  SourceLocation SVar7;
  SourceLocation in_stack_ffffffffffffffd0;
  
  if (((ulong)in_RDI[1].originatingSyntax & 1) == 0) {
    *(undefined1 *)&in_RDI[1].originatingSyntax = 1;
    pSVar2 = Symbol::getParentScope(in_RDI);
    SVar7 = in_RDI->location;
    errorLoc = (SourceLocation)Symbol::getSyntax(in_RDI);
    if (errorLoc != (SourceLocation)0x0) {
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>
                         ((SyntaxNode *)errorLoc);
      in_stack_ffffffffffffffd0 = parsing::Token::location(&pPVar3->package);
      SVar7 = in_stack_ffffffffffffffd0;
    }
    packageName._M_str = (char *)pSVar2;
    packageName._M_len = (size_t)SVar7;
    pPVar4 = findPackage(packageName,(Scope *)in_stack_ffffffffffffffd0,errorLoc,
                         SUB81(in_RDI[1].name._M_len >> 0x38,0));
    in_RDI[1].nextInScope = &pPVar4->super_Symbol;
    if (in_RDI[1].nextInScope == (Symbol *)0x0) {
      return (Symbol *)0x0;
    }
    pcVar6 = in_RDI[1].name._M_str;
    SVar7 = in_RDI[1].location;
    lookupName._M_str = (char *)this;
    lookupName._M_len = (size_t)scope;
    pSVar5 = PackageSymbol::findForImport((PackageSymbol *)loc,lookupName);
    *(Symbol **)&in_RDI[1].indexInScope = pSVar5;
    if ((*(long *)&in_RDI[1].indexInScope == 0) &&
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &in_RDI[1].name._M_str), !bVar1)) {
      this_00 = (Diagnostic *)Symbol::getSyntax(in_RDI);
      if (this_00 != (Diagnostic *)0x0) {
        pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>
                           ((SyntaxNode *)this_00);
        parsing::Token::location(&pPVar3->item);
      }
      Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
      arg._M_str = (char *)SVar7;
      arg._M_len = (size_t)pcVar6;
      Diagnostic::operator<<(this_00,arg);
      arg_00._M_str = (char *)SVar7;
      arg_00._M_len = (size_t)pcVar6;
      Diagnostic::operator<<(this_00,arg_00);
    }
  }
  return *(Symbol **)&in_RDI[1].indexInScope;
}

Assistant:

const Symbol* ExplicitImportSymbol::importedSymbol() const {
    if (!initialized) {
        initialized = true;

        const Scope* scope = getParentScope();
        SLANG_ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax())
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package_ = findPackage(packageName, *scope, loc, isFromExport);
        if (!package_)
            return nullptr;

        import = package_->findForImport(importName);
        if (!import) {
            if (!importName.empty()) {
                loc = location;
                if (auto syntax = getSyntax())
                    loc = syntax->as<PackageImportItemSyntax>().item.location();

                auto& diag = scope->addDiag(diag::UnknownPackageMember, loc);
                diag << importName << packageName;
            }
        }
    }
    return import;
}